

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O1

unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> __thiscall
duckdb::PrimitiveDictionary<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator>::
GetTargetMemoryStream
          (PrimitiveDictionary<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator> *this)

{
  data_ptr_t buffer;
  idx_t iVar1;
  MemoryStream *this_00;
  pointer this_01;
  pointer *__ptr;
  long in_RSI;
  MemoryStream *this_02;
  
  this_02 = (MemoryStream *)(in_RSI + 0x60);
  buffer = MemoryStream::GetData(this_02);
  iVar1 = MemoryStream::GetCapacity(this_02);
  this_00 = (MemoryStream *)operator_new(0x30);
  MemoryStream::MemoryStream(this_00,buffer,iVar1);
  this->allocator = (Allocator *)this_00;
  this_01 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
            operator->((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                        *)this);
  iVar1 = MemoryStream::GetPosition(this_02);
  MemoryStream::SetPosition(this_01,iVar1);
  return (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
         (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)this;
}

Assistant:

unique_ptr<MemoryStream> GetTargetMemoryStream() const {
		auto result = make_uniq<MemoryStream>(target_stream.GetData(), target_stream.GetCapacity());
		result->SetPosition(target_stream.GetPosition());
		return result;
	}